

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O2

Type __thiscall
wasm::anon_unknown_24::HeapTypeGeneratorImpl::generateSubtype(HeapTypeGeneratorImpl *this,Type type)

{
  size_t *this_00;
  pointer pvVar1;
  uint *puVar2;
  pointer pvVar3;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar4;
  pointer pTVar5;
  bool bVar6;
  Nullability share;
  Nullability NVar7;
  BasicHeapType BVar8;
  uint32_t uVar9;
  size_t __n;
  Type *pTVar10;
  uintptr_t *puVar11;
  uintptr_t uVar12;
  iterator iVar13;
  value_type *pvVar14;
  HeapType HVar15;
  undefined1 auVar16 [8];
  HeapType *this_01;
  HeapTypeGeneratorImpl *pHVar17;
  uint *puVar18;
  Exactness EVar19;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar20;
  HeapType local_a0;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true> local_98;
  Type local_90;
  Type type_local;
  undefined1 local_78 [8];
  Iterator __begin3;
  undefined1 auStack_58 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> types;
  
  local_90.id = type.id;
  if ((type.id & 1) != 0 && 6 < type.id) {
    auStack_58 = (undefined1  [8])0x0;
    types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    __n = Type::size(&local_90);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::reserve
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_58,__n);
    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    local_78 = (undefined1  [8])&local_90;
    PVar20 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)Type::end(&local_90);
    pTVar10 = (Type *)0x0;
    auVar16 = (undefined1  [8])&local_90;
    while (PVar4.index = (size_t)pTVar10, PVar4.parent = (Type *)auVar16, PVar20 != PVar4) {
      puVar11 = (uintptr_t *)wasm::Type::Iterator::operator*((Iterator *)local_78);
      type_local = generateSubtype(this,*puVar11);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::emplace_back<wasm::Type>
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_58,&type_local);
      pTVar10 = (Type *)((long)&(__begin3.
                                 super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                .parent)->id + 1);
      auVar16 = local_78;
      __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = pTVar10;
    }
    uVar12 = wasm::TypeBuilder::getTempTupleType(this->builder);
    std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
              ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_58);
    return (Type)uVar12;
  }
  if ((type.id & 1) != 0 || type.id < 7) {
    if (type.id < 7) {
      return (Type)type.id;
    }
    wasm::handle_unreachable
              ("unexpected type kind",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
               ,0x240);
  }
  type_local.id = (uintptr_t)Type::getHeapType(&local_90);
  EVar19 = (Exactness)(((uint)local_90.id & 3) == 2 && 6 < local_90.id);
  bVar6 = HeapType::isMaybeShared((HeapType *)&type_local,exn);
  if (bVar6) {
    NVar7 = (Nullability)type_local.id;
    goto LAB_0018c1c1;
  }
  if (EVar19 == Inexact) {
    EVar19 = Inexact;
  }
  else {
    bVar6 = Random::oneIn(this->rand,2);
    EVar19 = (Exactness)bVar6;
  }
  __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = type_local.id
  ;
  share = wasm::HeapType::getShared();
  iVar13 = std::
           _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(&(this->typeIndices)._M_h,
                  (key_type *)
                  &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                   index);
  if (iVar13.super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>._M_cur
      != (__node_type *)0x0) {
    auStack_58 = (undefined1  [8])0x0;
    types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pvVar1 = (this->subtypeIndices->
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    puVar2 = *(pointer *)
              ((long)&pvVar1[*(uint *)((long)iVar13.
                                             super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                             ._M_cur + 0x10)].
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data + 8);
    local_98 = iVar13.super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
               ._M_cur;
    types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = EVar19;
    for (puVar18 = pvVar1[*(uint *)((long)iVar13.
                                          super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                          ._M_cur + 0x10)].
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start; puVar18 != puVar2; puVar18 = puVar18 + 1) {
      if (*puVar18 <
          (this->recGroupEnds).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start[this->index]) {
        local_78 = (undefined1  [8])this->builder;
        __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)(ulong)*puVar18;
        local_a0 = TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)local_78);
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::emplace_back<wasm::HeapType>
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_58,&local_a0);
      }
    }
    bVar6 = Random::oneIn(this->rand,
                          (int)types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                               _M_impl.super__Vector_impl_data._M_start - auStack_58._0_4_ &
                          0xfffffff8);
    EVar19 = types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_;
    if (bVar6) {
      pvVar3 = (this->typeKinds).
               super__Vector_base<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((pvVar3 == (pointer)0x0) ||
         (*(__index_type *)
           ((long)&pvVar3[*(uint *)((long)&((local_98._M_cur)->
                                           super__Hash_node_value<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                           ).
                                           super__Hash_node_value_base<std::pair<const_wasm::HeapType,_unsigned_int>_>
                                           ._M_storage._M_storage + 8)].
                   super__Variant_base<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                   .
                   super__Move_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                   .
                   super__Copy_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
           + 1) != '\0')) {
        NVar7 = HeapType::getBasic((HeapType *)&HeapTypes::none,share);
      }
      else {
        NVar7 = HeapType::getBasic((HeapType *)&HeapTypes::nofunc,share);
      }
    }
    else {
      if (auStack_58 ==
          (undefined1  [8])
          types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start) {
        __assert_fail("!candidates.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                      ,0x1ad,
                      "HeapType wasm::(anonymous namespace)::HeapTypeGeneratorImpl::pickSubHeapType(HeapType)"
                     );
      }
      pvVar14 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                          (this->rand,
                           (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_58);
      NVar7 = (Nullability)pvVar14->id;
    }
    std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
              ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_58);
    goto LAB_0018c1c1;
  }
  if (0x7c < __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index) {
    __assert_fail("type.isBasic()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                  ,0x1b1,
                  "HeapType wasm::(anonymous namespace)::HeapTypeGeneratorImpl::pickSubHeapType(HeapType)"
                 );
  }
  bVar6 = Random::oneIn(this->rand,8);
  this_00 = &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
  if (bVar6) {
    NVar7 = HeapType::getBottom((HeapType *)this_00);
    goto LAB_0018c1c1;
  }
  BVar8 = HeapType::getBasic((HeapType *)this_00,Unshared);
  switch(BVar8 << 0x1d | BVar8 - ext >> 3) {
  case 0:
  case ext:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
    NVar7 = (Nullability)
            __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
    break;
  case 1:
    HVar15 = pickSubFunc(this,share);
    NVar7 = (Nullability)HVar15.id;
    break;
  case 2:
    wasm::handle_unreachable
              ("not implemented",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
               ,0x1b9);
  case 3:
    HVar15 = pickSubAny(this,share);
    NVar7 = (Nullability)HVar15.id;
    break;
  case 4:
    HVar15 = pickSubEq(this,share);
    NVar7 = (Nullability)HVar15.id;
    break;
  case 5:
    this_01 = (HeapType *)&HeapTypes::i31;
    goto LAB_0018c269;
  case 6:
    uVar9 = Random::upTo(this->rand,8);
    if (uVar9 == 1) {
LAB_0018c25f:
      this_01 = (HeapType *)&HeapTypes::none;
    }
    else if (uVar9 == 0) {
      this_01 = (HeapType *)&HeapTypes::struct_;
    }
    else {
      types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = EVar19;
      getKindCandidates<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind>
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_58,this,share);
      pTVar5 = types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start;
      auVar16 = auStack_58;
      NVar7 = share;
      if ((undefined1  [8])
          types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start != auStack_58) {
        pvVar14 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                            (this->rand,
                             (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_58);
        NVar7 = (Nullability)pvVar14->id;
      }
      EVar19 = types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_;
      std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
                ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_58);
      if ((undefined1  [8])pTVar5 != auVar16) break;
      auStack_58 = (undefined1  [8])((ulong)((uVar9 & 1) == 0) * 0x20 + 0x38);
LAB_0018c342:
      this_01 = (HeapType *)auStack_58;
    }
    goto LAB_0018c269;
  case 7:
    uVar9 = Random::upTo(this->rand,8);
    if (uVar9 == 1) goto LAB_0018c25f;
    if (uVar9 != 0) {
      getKindCandidates<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_58,this,share);
      pTVar5 = types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start;
      auVar16 = auStack_58;
      pHVar17 = this;
      if ((undefined1  [8])
          types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start != auStack_58) {
        pvVar14 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                            (this->rand,
                             (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_58);
        pHVar17 = (HeapTypeGeneratorImpl *)pvVar14->id;
      }
      NVar7 = (Nullability)pHVar17;
      std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
                ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_58);
      if ((undefined1  [8])pTVar5 != auVar16) break;
      auStack_58 = (undefined1  [8])(pointer)0x40;
      if ((uVar9 & 1) == 0) {
        auStack_58 = (undefined1  [8])(pointer)0x58;
      }
      goto LAB_0018c342;
    }
    this_01 = (HeapType *)&HeapTypes::array;
LAB_0018c269:
    NVar7 = HeapType::getBasic(this_01,share);
    break;
  default:
    wasm::handle_unreachable
              ("unexpected type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
               ,0x1ce);
  }
LAB_0018c1c1:
  uVar12 = wasm::TypeBuilder::getTempRefType((HeapType)this->builder,NVar7,EVar19);
  return (Type)uVar12;
}

Assistant:

Type generateSubtype(Type type) {
    if (type.isTuple()) {
      std::vector<Type> types;
      types.reserve(type.size());
      for (auto t : type) {
        types.push_back(generateSubtype(t));
      }
      return builder.getTempTupleType(types);
    } else if (type.isRef()) {
      auto ref = generateSubRef({type.getHeapType(), type.getNullability()});
      return builder.getTempRefType(ref.type, ref.nullability);
    } else if (type.isBasic()) {
      // Non-reference basic types do not have subtypes.
      return type;
    } else {
      WASM_UNREACHABLE("unexpected type kind");
    }
  }